

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::Seal
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  BOOL BVar1;
  IndexPropertyDescriptor *pIVar2;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int index;
  
  this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
  if (0 < this_00->count - this_00->freeCount) {
    index = 0;
    do {
      pIVar2 = JsUtil::
               BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetReferenceAt(this_00,index);
      pIVar2->Attributes = pIVar2->Attributes & 0xfd;
      index = index + 1;
      this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
    } while (index < this_00->count - this_00->freeCount);
  }
  this->dataItemAttributes = this->dataItemAttributes & 0xfd;
  BVar1 = DictionaryTypeHandlerBase<unsigned_short>::Seal
                    (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance);
  return BVar1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::Seal(DynamicObject* instance)
    {
        IndexPropertyDescriptor* descriptor = NULL;
        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            descriptor = indexPropertyMap->GetReferenceAt(i);
            descriptor->Attributes &= (~PropertyConfigurable);
        }

        this->SetDataItemSealed(); // set shared data item attributes sealed

        return __super::Seal(instance);
    }